

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O2

char * get_login(CHAR_DATA *ch,FILE *fpChar2)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *astr;
  
  if (fpChar2 == (FILE *)0x0) {
    send_to_char("Error opening pfile.\n\r",ch);
    pcVar5 = "";
  }
  else {
    pcVar5 = (char *)0x0;
    do {
      while( true ) {
        iVar3 = feof((FILE *)fpChar2);
        astr = "End";
        if (iVar3 == 0) {
          astr = fread_word(fpChar2);
        }
        cVar1 = *astr;
        uVar4 = (int)cVar1 - 0x20U & 0xff;
        if (0x19 < (byte)(cVar1 + 0x9fU)) {
          uVar4 = (int)cVar1;
        }
        if (uVar4 != 0x4c) break;
        bVar2 = str_cmp(astr,"LogonTime");
        if (bVar2) {
LAB_003215fc:
          fread_to_eol(fpChar2);
        }
        else {
          pcVar5 = fread_string(fpChar2);
        }
      }
      if (uVar4 != 0x45) goto LAB_003215fc;
      bVar2 = str_cmp(astr,"End");
      fread_to_eol(fpChar2);
    } while (bVar2);
  }
  return pcVar5;
}

Assistant:

char *get_login(CHAR_DATA *ch, FILE *fpChar2)
{
	bool fMatch, end = false;
	char *login = nullptr, *word;

	if (fpChar2 == nullptr)
	{
		send_to_char("Error opening pfile.\n\r", ch);
		return "";
	}

	for (;;)
	{
		fMatch = false;
		word = feof(fpChar2) ? (char *)"End" : fread_word(fpChar2);

		switch (UPPER(word[0]))
		{
			case 'E':
				if (!str_cmp(word, "End"))
				{
					end = true;
				}
				break;
			case 'L':
				KEY("LogonTime", login, fread_string(fpChar2))
				break;
		}

		if (!fMatch)
			fread_to_eol(fpChar2);

		if (end)
			break;
	}

	return login;
}